

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int unixWrite(unqlite_file *id,void *pBuf,unqlite_int64 amt,unqlite_int64 offset)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  __off_t _Var4;
  ssize_t sVar5;
  ulong uVar6;
  int *piVar7;
  int iVar8;
  unixFile *pFile;
  size_t sVar9;
  
  if (amt < 1) {
    return 0;
  }
  while (_Var4 = lseek(*(int *)&id[2].pMethods,offset,0), _Var4 == offset) {
    sVar5 = write(*(int *)&id[2].pMethods,pBuf,amt);
    uVar2 = (uint)sVar5;
    if ((int)uVar2 < 0) goto LAB_0010f95e;
    if (uVar2 == 0) {
      iVar3 = -0x49;
      goto LAB_0010f971;
    }
    uVar6 = (ulong)(uVar2 & 0x7fffffff);
    offset = offset + uVar6;
    pBuf = (void *)((long)pBuf + uVar6);
    sVar9 = amt - uVar6;
    bVar1 = amt < (long)uVar6;
    amt = sVar9;
    if (sVar9 == 0 || bVar1) {
      return 0;
    }
  }
  if (_Var4 != -1) {
    iVar3 = -2;
LAB_0010f971:
    iVar8 = 0;
    goto LAB_0010f973;
  }
LAB_0010f95e:
  piVar7 = __errno_location();
  iVar8 = *piVar7;
  iVar3 = -2;
LAB_0010f973:
  *(int *)((long)&id[3].pMethods + 4) = iVar8;
  return iVar3;
}

Assistant:

static int unixWrite(
  unqlite_file *id, 
  const void *pBuf, 
  unqlite_int64 amt,
  unqlite_int64 offset 
){
  unixFile *pFile = (unixFile*)id;
  int wrote = 0;

  while( amt>0 && (wrote = seekAndWrite(pFile, offset, pBuf, amt))>0 ){
    amt -= wrote;
    offset += wrote;
    pBuf = &((char*)pBuf)[wrote];
  }
  
  if( amt>0 ){
    if( wrote<0 ){
      /* lastErrno set by seekAndWrite */
      return UNQLITE_IOERR;
    }else{
      pFile->lastErrno = 0; /* not a system error */
      return UNQLITE_FULL;
    }
  }
  return UNQLITE_OK;
}